

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QTreeViewItem>::copyAppend
          (QGenericArrayOps<QTreeViewItem> *this,QTreeViewItem *b,QTreeViewItem *e)

{
  qsizetype *pqVar1;
  QTreeViewItem *pQVar2;
  totally_ordered_wrapper<const_QAbstractItemModel_*> *ptVar3;
  QTreeViewItem *pQVar4;
  long lVar5;
  quintptr qVar6;
  undefined8 uVar7;
  int iVar8;
  int iVar9;
  
  if (b != e) {
    pQVar4 = (this->super_QArrayDataPointer<QTreeViewItem>).ptr;
    for (; b < e; b = b + 1) {
      lVar5 = (this->super_QArrayDataPointer<QTreeViewItem>).size;
      *(undefined8 *)&pQVar4[lVar5].field_0x20 = *(undefined8 *)&b->field_0x20;
      iVar8 = (b->index).r;
      iVar9 = (b->index).c;
      qVar6 = (b->index).i;
      uVar7 = *(undefined8 *)&b->parentItem;
      ptVar3 = &pQVar4[lVar5].index.m;
      ptVar3->ptr = (b->index).m.ptr;
      ptVar3[1] = (totally_ordered_wrapper<const_QAbstractItemModel_*>)uVar7;
      pQVar2 = pQVar4 + lVar5;
      (pQVar2->index).r = iVar8;
      (pQVar2->index).c = iVar9;
      (pQVar2->index).i = qVar6;
      pqVar1 = &(this->super_QArrayDataPointer<QTreeViewItem>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }